

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate_init.inc.c
# Opt level: O1

void gen_spr_power8_book4(CPUPPCState_conflict2 *env)

{
  undefined8 uVar1;
  undefined8 uVar2;
  
  if (((((env->spr_cb[0x1f].name == (char *)0x0) && (env->spr[0x1f] == 0)) &&
       (env->spr_cb[0x1f].oea_read == (_func_void_DisasContext_ptr_int_int *)0x0)) &&
      ((env->spr_cb[0x1f].oea_write == (_func_void_DisasContext_ptr_int_int *)0x0 &&
       (env->spr_cb[0x1f].uea_read == (_func_void_DisasContext_ptr_int_int *)0x0)))) &&
     (env->spr_cb[0x1f].uea_write == (_func_void_DisasContext_ptr_int_int *)0x0)) {
    env->spr_cb[0x1f].name = "ACOP";
    env->spr_cb[0x1f].uea_read = spr_noaccess;
    env->spr_cb[0x1f].uea_write = spr_noaccess;
    env->spr_cb[0x1f].oea_read = spr_read_generic;
    env->spr_cb[0x1f].oea_write = spr_write_generic;
    env->spr_cb[0x1f].hea_read = spr_read_generic;
    env->spr_cb[0x1f].hea_write = spr_write_generic;
    env->spr_cb[0x1f].default_value = 0;
    env->spr[0x1f] = 0;
    if (((env->spr_cb[0x30].name == (char *)0x0) && (env->spr[0x30] == 0)) &&
       ((env->spr_cb[0x30].oea_read == (_func_void_DisasContext_ptr_int_int *)0x0 &&
        (((env->spr_cb[0x30].oea_write == (_func_void_DisasContext_ptr_int_int *)0x0 &&
          (env->spr_cb[0x30].uea_read == (_func_void_DisasContext_ptr_int_int *)0x0)) &&
         (env->spr_cb[0x30].uea_write == (_func_void_DisasContext_ptr_int_int *)0x0)))))) {
      env->spr_cb[0x30].name = "PID";
      env->spr_cb[0x30].uea_read = spr_noaccess;
      env->spr_cb[0x30].uea_write = spr_noaccess;
      env->spr_cb[0x30].oea_read = spr_read_generic;
      env->spr_cb[0x30].oea_write = spr_write_pidr;
      env->spr_cb[0x30].hea_read = spr_read_generic;
      env->spr_cb[0x30].hea_write = spr_write_pidr;
      env->spr_cb[0x30].default_value = 0;
      env->spr[0x30] = 0;
      if ((((env->spr_cb[0x37f].name == (char *)0x0) && (env->spr[0x37f] == 0)) &&
          ((env->spr_cb[0x37f].oea_read == (_func_void_DisasContext_ptr_int_int *)0x0 &&
           ((env->spr_cb[0x37f].oea_write == (_func_void_DisasContext_ptr_int_int *)0x0 &&
            (env->spr_cb[0x37f].uea_read == (_func_void_DisasContext_ptr_int_int *)0x0)))))) &&
         (env->spr_cb[0x37f].uea_write == (_func_void_DisasContext_ptr_int_int *)0x0)) {
        env->spr_cb[0x37f].name = "WORT";
        env->spr_cb[0x37f].uea_read = spr_noaccess;
        env->spr_cb[0x37f].uea_write = spr_noaccess;
        env->spr_cb[0x37f].oea_read = spr_read_generic;
        env->spr_cb[0x37f].oea_write = spr_write_generic;
        env->spr_cb[0x37f].hea_read = spr_read_generic;
        env->spr_cb[0x37f].hea_write = spr_write_generic;
        env->spr_cb[0x37f].default_value = 0;
        env->spr[0x37f] = 0;
        return;
      }
      uVar2 = 0x37f;
      uVar1 = 0x37f;
    }
    else {
      uVar2 = 0x30;
      uVar1 = 0x30;
    }
  }
  else {
    uVar2 = 0x1f;
    uVar1 = 0x1f;
  }
  printf("Error: Trying to register SPR %d (%03x) twice !\n",uVar2,uVar1);
  exit(1);
}

Assistant:

static void gen_spr_power8_book4(CPUPPCState *env)
{
    /* Add a number of P8 book4 registers */
    spr_register_kvm(env, SPR_ACOP, "ACOP",
                     SPR_NOACCESS, SPR_NOACCESS,
                     &spr_read_generic, &spr_write_generic,
                     KVM_REG_PPC_ACOP, 0);
    spr_register_kvm(env, SPR_BOOKS_PID, "PID",
                     SPR_NOACCESS, SPR_NOACCESS,
                     &spr_read_generic, &spr_write_pidr,
                     KVM_REG_PPC_PID, 0);
    spr_register_kvm(env, SPR_WORT, "WORT",
                     SPR_NOACCESS, SPR_NOACCESS,
                     &spr_read_generic, &spr_write_generic,
                     KVM_REG_PPC_WORT, 0);
}